

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_vector.h
# Opt level: O2

bool bsim::operator>(signed_int<12> *a,signed_int<12> *b)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  byte bVar4;
  bool bVar5;
  
  bVar5 = ((a->bits).bits[1] & 8) == 0;
  bVar1 = (b->bits).bits[1];
  if (bVar5) {
    bVar1 = (bVar1 & 8) >> 3;
    if ((bVar5 & bVar1) != 0) {
      return true;
    }
  }
  else if ((bVar1 & 8) == 0) {
    return false;
  }
  uVar3 = 10;
  do {
    iVar2 = (int)uVar3;
    if (iVar2 < 0) goto LAB_00149e8b;
    bVar4 = (byte)uVar3 & 7;
    bVar1 = ((a->bits).bits[uVar3 >> 3] >> bVar4 & 1) != 0;
    bVar5 = ((b->bits).bits[uVar3 >> 3] >> bVar4 & 1) != 0;
    if (bVar5 < bVar1) {
      bVar1 = 1;
      goto LAB_00149e8b;
    }
    uVar3 = (ulong)(iVar2 - 1);
  } while (bVar5 <= bVar1);
  bVar1 = 0;
LAB_00149e8b:
  return (bool)(-1 < iVar2 & bVar1);
}

Assistant:

static inline bool operator>(const signed_int<N>& a,
			       const signed_int<N>& b) {

    // a negative b non-negative
    if ((a.get(N - 1) == 1) && (b.get(N - 1) == 0)) {
      return false;
    }

    // b negative a non-negative
    if ((b.get(N - 1) == 1) && (a.get(N - 1) == 0)) {
      return true;
    }

    // Both negative or both non-negative
    //if ((a.get(N - 1) == 1) && (b.get(N - 1) == 1)) {

    for (int i = N - 2; i >= 0; i--) {
      if (a.get(i) > b.get(i)) {
	return true;
      }

      if (a.get(i) < b.get(i)) {
	return false;
      }
    }

    return false;

  }